

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryTTF
          (ImFontAtlas *this,void *ttf_data,int ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  ImFont *pIVar1;
  ImFontConfig local_c0;
  float local_38;
  
  if (this->Locked == true) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_draw.cpp"
                  ,0x880,
                  "ImFont *ImFontAtlas::AddFontFromMemoryTTF(void *, int, float, const ImFontConfig *, const ImWchar *)"
                 );
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    local_c0.FontNo = 0;
    local_c0.SizePixels = 0.0;
    local_c0.PixelSnapH = false;
    local_c0._33_3_ = 0;
    local_c0.GlyphExtraSpacing.x = 0.0;
    local_c0.GlyphRanges = (ImWchar *)0x0;
    local_c0.MergeMode = false;
    local_c0._73_3_ = 0;
    local_c0.FontBuilderFlags = 0;
    local_c0.Name[0x22] = '\0';
    local_c0.Name[0x23] = '\0';
    local_c0.Name[0x24] = '\0';
    local_c0.Name[0x25] = '\0';
    local_c0.Name[0x26] = '\0';
    local_c0.Name[0x27] = '\0';
    local_c0._126_2_ = 0;
    local_c0.DstFont = (ImFont *)0x0;
    local_c0.Name[0x12] = '\0';
    local_c0.Name[0x13] = '\0';
    local_c0.Name[0x14] = '\0';
    local_c0.Name[0x15] = '\0';
    local_c0.Name[0x16] = '\0';
    local_c0.Name[0x17] = '\0';
    local_c0.Name[0x18] = '\0';
    local_c0.Name[0x19] = '\0';
    local_c0.Name[0x1a] = '\0';
    local_c0.Name[0x1b] = '\0';
    local_c0.Name[0x1c] = '\0';
    local_c0.Name[0x1d] = '\0';
    local_c0.Name[0x1e] = '\0';
    local_c0.Name[0x1f] = '\0';
    local_c0.Name[0x20] = '\0';
    local_c0.Name[0x21] = '\0';
    local_c0.Name[2] = '\0';
    local_c0.Name[3] = '\0';
    local_c0.Name[4] = '\0';
    local_c0.Name[5] = '\0';
    local_c0.Name[6] = '\0';
    local_c0.Name[7] = '\0';
    local_c0.Name[8] = '\0';
    local_c0.Name[9] = '\0';
    local_c0.Name[10] = '\0';
    local_c0.Name[0xb] = '\0';
    local_c0.Name[0xc] = '\0';
    local_c0.Name[0xd] = '\0';
    local_c0.Name[0xe] = '\0';
    local_c0.Name[0xf] = '\0';
    local_c0.Name[0x10] = '\0';
    local_c0.Name[0x11] = '\0';
    local_c0.GlyphExtraSpacing.y = 0.0;
    local_c0.GlyphOffset.x = 0.0;
    local_c0.GlyphOffset.y = 0.0;
    local_c0._52_4_ = 0;
    local_c0.FontDataOwnedByAtlas = true;
    local_c0._13_3_ = 0;
    local_c0.OversampleH = 3;
    local_c0.OversampleV = 1;
    local_c0.GlyphMinAdvanceX = 0.0;
    local_c0.GlyphMaxAdvanceX = 3.4028235e+38;
    local_c0.RasterizerMultiply = 1.0;
    local_c0.EllipsisChar = 0xffff;
    local_c0.Name[0] = '\0';
    local_c0.Name[1] = '\0';
  }
  else {
    local_38 = size_pixels;
    memcpy(&local_c0,font_cfg_template,0x88);
    size_pixels = local_38;
    if (local_c0.FontData != (void *)0x0) {
      __assert_fail("font_cfg.FontData == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_draw.cpp"
                    ,0x882,
                    "ImFont *ImFontAtlas::AddFontFromMemoryTTF(void *, int, float, const ImFontConfig *, const ImWchar *)"
                   );
    }
  }
  local_c0.FontDataSize = ttf_size;
  local_c0.SizePixels =
       (float)(~-(uint)(0.0 < size_pixels) & (uint)local_c0.SizePixels |
              (uint)size_pixels & -(uint)(0.0 < size_pixels));
  if (glyph_ranges != (ImWchar *)0x0) {
    local_c0.GlyphRanges = glyph_ranges;
  }
  local_c0.FontData = ttf_data;
  pIVar1 = AddFont(this,&local_c0);
  return pIVar1;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryTTF(void* ttf_data, int ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontData = ttf_data;
    font_cfg.FontDataSize = ttf_size;
    font_cfg.SizePixels = size_pixels > 0.0f ? size_pixels : font_cfg.SizePixels;
    if (glyph_ranges)
        font_cfg.GlyphRanges = glyph_ranges;
    return AddFont(&font_cfg);
}